

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::format_uint<3u,char,fmt::v8::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  char *buffer_00;
  uint in_ECX;
  undefined1 local_68 [8];
  char buffer [43];
  
  buffer_00 = to_pointer<char>((buffer_appender<char>)
                               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container,(ulong)in_ECX);
  if (buffer_00 == (char *)0x0) {
    format_uint<3u,char,unsigned__int128>(local_68,(unsigned___int128)_local_68,num_digits,upper);
    out = copy_str_noinline<char,char*,fmt::v8::appender>(local_68,local_68 + (int)in_ECX,out);
  }
  else {
    format_uint<3u,char,unsigned__int128>(buffer_00,(unsigned___int128)_local_68,num_digits,upper);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}